

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::create_object_implicitly
          (void *param_1)

{
  semantic_tag sVar1;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  allocator<char> local_22 [2];
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> local_20;
  void *local_10;
  
  local_10 = param_1;
  sVar1 = tag((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
              CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  std::allocator<char>::allocator();
  basic_json(&local_20,sVar1,local_22);
  operator=((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)param_1,
            in_stack_ffffffffffffffa8);
  ~basic_json((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x20675c);
  std::allocator<char>::~allocator(local_22);
  return;
}

Assistant:

void create_object_implicitly(std::true_type)
        {
            *this = basic_json(json_object_arg, tag());
        }